

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this,ConfigData *param_1)

{
  pointer pcVar1;
  int iVar2;
  Level LVar3;
  What WVar4;
  OrNot OVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 uVar17;
  
  this->runOrder = param_1->runOrder;
  bVar6 = param_1->listTests;
  bVar7 = param_1->listTags;
  bVar8 = param_1->listReporters;
  bVar9 = param_1->listTestNamesOnly;
  bVar10 = param_1->showSuccessfulTests;
  bVar11 = param_1->shouldDebugBreak;
  bVar12 = param_1->noThrow;
  bVar13 = param_1->showHelp;
  bVar14 = param_1->showInvisibles;
  bVar15 = param_1->forceColour;
  bVar16 = param_1->filenamesAsTags;
  uVar17 = param_1->field_0xb;
  iVar2 = param_1->abortAfter;
  LVar3 = param_1->verbosity;
  WVar4 = param_1->warnings;
  OVar5 = param_1->showDurations;
  this->rngSeed = param_1->rngSeed;
  this->verbosity = LVar3;
  this->warnings = WVar4;
  this->showDurations = OVar5;
  this->listTests = bVar6;
  this->listTags = bVar7;
  this->listReporters = bVar8;
  this->listTestNamesOnly = bVar9;
  this->showSuccessfulTests = bVar10;
  this->shouldDebugBreak = bVar11;
  this->noThrow = bVar12;
  this->showHelp = bVar13;
  this->showInvisibles = bVar14;
  this->forceColour = bVar15;
  this->filenamesAsTags = bVar16;
  this->field_0xb = uVar17;
  this->abortAfter = iVar2;
  (this->outputFilename)._M_dataplus._M_p = (pointer)&(this->outputFilename).field_2;
  pcVar1 = (param_1->outputFilename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->outputFilename,pcVar1,
             pcVar1 + (param_1->outputFilename)._M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (param_1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (param_1->name)._M_string_length);
  (this->processName)._M_dataplus._M_p = (pointer)&(this->processName).field_2;
  pcVar1 = (param_1->processName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->processName,pcVar1,pcVar1 + (param_1->processName)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reporterNames,&param_1->reporterNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testsOrTags,&param_1->testsOrTags);
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            listTestNamesOnly( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            showInvisibles( false ),
            forceColour( false ),
            filenamesAsTags( false ),
            abortAfter( -1 ),
            rngSeed( 0 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing ),
            showDurations( ShowDurations::DefaultForReporter ),
            runOrder( RunTests::InDeclarationOrder )
        {}